

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_array_global.cpp
# Opt level: O3

void __thiscall
optimization::func_array_global::Func_Array_Global::optimize_func
          (Func_Array_Global *this,MirFunction *func,MirPackage *mir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  Displayable DVar4;
  _Base_ptr p_Var5;
  MirPackage *pMVar6;
  pointer pcVar7;
  _Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> _Var8;
  byte bVar9;
  size_type sVar10;
  undefined4 uVar11;
  uint32_t uVar12;
  _Head_base<0UL,_mir::inst::RefInst_*,_false> _Var13;
  pointer puVar14;
  pointer puVar15;
  _Base_ptr *this_00;
  int iVar16;
  _Rb_tree_node_base *p_Var17;
  _Base_ptr p_Var18;
  MirFunction *pMVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  uint extraout_var;
  long *plVar23;
  long lVar24;
  ostream *poVar25;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var26;
  RefInst *pRVar27;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator __position;
  undefined8 uVar28;
  int iVar29;
  _Base_ptr p_Var30;
  RefInst *pRVar31;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Rb_tree_header *p_Var32;
  _Base_ptr p_Var33;
  _Alloc_hider _Var34;
  pointer __args;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *__args_00;
  pointer *__ptr_1;
  iterator __begin5;
  _Base_ptr p_Var35;
  _Base_ptr p_Var36;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *this_01;
  RefInst *pRVar37;
  RefInst *pRVar38;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  ulong uVar39;
  pointer *__ptr;
  pair<std::_Rb_tree_iterator<mir::inst::VarId>,_std::_Rb_tree_iterator<mir::inst::VarId>_> pVar40;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  pVar41;
  VarId var;
  VarId var_3;
  VarId init_var;
  GlobalVarManager gvm;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> ref_results;
  VarId ref_var;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  init_insts;
  string name;
  mapped_type def_point;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  call_insts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> vars;
  Var_Replace vp;
  string local_418;
  _Base_ptr local_3f8;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 uStack_3d0;
  undefined3 uStack_3cf;
  undefined4 uStack_3cc;
  _Alloc_hider local_3c8;
  size_type local_3c0;
  uint local_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  size_t local_3a8;
  bool local_3a0;
  _Base_ptr local_398;
  _Head_base<0UL,_mir::inst::RefInst_*,_false> local_390;
  size_type local_388;
  undefined1 local_380 [24];
  undefined1 local_368 [16];
  key_type local_358;
  _Head_base<0UL,_mir::inst::RefInst_*,_false> local_348;
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330;
  undefined7 uStack_32f;
  undefined1 local_320;
  MirPackage *local_318;
  undefined1 local_310 [8];
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_308;
  undefined **local_2d8;
  uint local_2d0 [2];
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_2c8;
  string local_2a8;
  pthread_mutex_t *local_288;
  mapped_type local_280;
  string local_278;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_258;
  _Base_ptr local_238;
  element_type *local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  undefined8 local_220;
  _Base_ptr local_218;
  element_type *local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  undefined8 local_200;
  _Base_ptr local_1f8;
  _Base_ptr *local_1f0;
  _func_int **local_1e8;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_1e0;
  _Rb_tree_node_base *local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  Timestamp local_1b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  undefined1 local_188 [8];
  undefined1 local_180 [16];
  _Rb_tree_node_base *local_170;
  _Base_ptr local_160;
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_150;
  undefined **local_120;
  undefined4 local_118;
  undefined **local_110;
  uint32_t local_108;
  undefined **local_100;
  undefined4 local_f8;
  undefined **local_f0;
  uint32_t local_e8;
  VarId local_e0;
  undefined1 local_d0 [8];
  variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  _Optional_payload_base<int> local_a0;
  Var_Replace local_98;
  
  if (((func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (iVar16 = std::__cxx11::string::compare((char *)&func->name), iVar16 != 0)) {
    DVar4._vptr_Displayable =
         (_func_int **)(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_380._16_8_ = func;
    local_318 = mir;
    var_replace::Var_Replace::Var_Replace(&local_98,func);
    local_308._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_308._M_impl.super__Rb_tree_header._M_header;
    local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var18 = ((_Base_ptr)(DVar4._vptr_Displayable + 0xc))->_M_parent;
    p_Var33 = ((_Base_ptr)(DVar4._vptr_Displayable + 0xc))->_M_left;
    local_368._0_8_ = DVar4._vptr_Displayable;
    local_308._M_impl.super__Rb_tree_header._M_header._M_right =
         local_308._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var18 != p_Var33) {
      do {
        iVar16 = (**(code **)(**(long **)p_Var18 + 8))();
        if (iVar16 == 2) {
          (**(code **)(**(long **)p_Var18 + 0x10))
                    ((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      *)local_188);
          p_Var5 = local_160;
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)local_188);
          if (p_Var5 != (_Base_ptr)0x0) {
            std::
            _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
            ::_M_insert_unique<mir::inst::VarId_const&>
                      ((_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                        *)&local_308,(VarId *)(*(long *)p_Var18 + 8));
          }
        }
        p_Var18 = (_Base_ptr)&p_Var18->_M_parent;
      } while (p_Var18 != p_Var33);
      p_Var18 = ((_Base_ptr)(local_368._0_8_ + 0x60))->_M_parent;
      p_Var33 = ((_Base_ptr)(local_368._0_8_ + 0x60))->_M_left;
      if (p_Var18 != p_Var33) {
        do {
          iVar16 = (**(code **)(**(long **)p_Var18 + 8))();
          if (iVar16 == 4) {
            (**(code **)(**(long **)p_Var18 + 0x10))(local_188);
            p_Var17 = local_170;
            if (local_170 != (_Rb_tree_node_base *)local_180 && (_Base_ptr)0x1 < local_160) {
              do {
                local_3f0._0_8_ = &PTR_display_001eb100;
                uVar2 = *(uint *)&p_Var17[1]._M_parent;
                local_3f0._8_4_ = uVar2;
                if (local_308._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                  p_Var5 = local_308._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var36 = &local_308._M_impl.super__Rb_tree_header._M_header;
                  do {
                    p_Var35 = p_Var36;
                    p_Var30 = p_Var5;
                    uVar3 = *(uint *)&p_Var30[1]._M_parent;
                    p_Var36 = p_Var30;
                    if (uVar3 < uVar2) {
                      p_Var36 = p_Var35;
                    }
                    p_Var5 = (&p_Var30->_M_left)[uVar3 < uVar2];
                  } while ((&p_Var30->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                  if ((_Rb_tree_header *)p_Var36 != &local_308._M_impl.super__Rb_tree_header) {
                    if (uVar3 < uVar2) {
                      p_Var30 = p_Var35;
                    }
                    if (*(uint *)&p_Var30[1]._M_parent <= uVar2) {
                      pVar40 = std::
                               _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                               ::equal_range(&local_308,(key_type *)local_3f0);
                      std::
                      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::_M_erase_aux(&local_308,(_Base_ptr)pVar40.first._M_node,
                                     (_Base_ptr)pVar40.second._M_node);
                    }
                  }
                }
                p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              } while (p_Var17 != (_Rb_tree_node_base *)local_180);
            }
LAB_001520e9:
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)local_188);
          }
          else {
            iVar16 = (**(code **)(**(long **)p_Var18 + 8))();
            if ((iVar16 == 6) &&
               (iVar16 = std::__cxx11::string::compare((char *)(*(long *)p_Var18 + 0x18)),
               iVar16 != 0)) {
              (**(code **)(**(long **)p_Var18 + 0x10))(local_188);
              p_Var17 = local_170;
              if (local_170 != (_Rb_tree_node_base *)local_180 && (_Base_ptr)0x1 < local_160) {
                do {
                  local_3f0._0_8_ = &PTR_display_001eb100;
                  uVar2 = *(uint *)&p_Var17[1]._M_parent;
                  local_3f0._8_4_ = uVar2;
                  if (local_308._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
                  {
                    p_Var5 = local_308._M_impl.super__Rb_tree_header._M_header._M_parent;
                    p_Var36 = &local_308._M_impl.super__Rb_tree_header._M_header;
                    do {
                      p_Var35 = p_Var36;
                      p_Var30 = p_Var5;
                      uVar3 = *(uint *)&p_Var30[1]._M_parent;
                      p_Var36 = p_Var30;
                      if (uVar3 < uVar2) {
                        p_Var36 = p_Var35;
                      }
                      p_Var5 = (&p_Var30->_M_left)[uVar3 < uVar2];
                    } while ((&p_Var30->_M_left)[uVar3 < uVar2] != (_Base_ptr)0x0);
                    if ((_Rb_tree_header *)p_Var36 != &local_308._M_impl.super__Rb_tree_header) {
                      if (uVar3 < uVar2) {
                        p_Var30 = p_Var35;
                      }
                      if (*(uint *)&p_Var30[1]._M_parent <= uVar2) {
                        pVar40 = std::
                                 _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 ::equal_range(&local_308,(key_type *)local_3f0);
                        std::
                        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        ::_M_erase_aux(&local_308,(_Base_ptr)pVar40.first._M_node,
                                       (_Base_ptr)pVar40.second._M_node);
                      }
                    }
                  }
                  p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
                } while (p_Var17 != (_Rb_tree_node_base *)local_180);
              }
              goto LAB_001520e9;
            }
          }
          p_Var18 = (_Base_ptr)&p_Var18->_M_parent;
        } while (p_Var18 != p_Var33);
      }
    }
    p_Var18 = (((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 *)(local_380._16_8_ + 0x68))->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    local_368._8_8_ =
         &(((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             *)(local_380._16_8_ + 0x68))->_M_t)._M_impl.super__Rb_tree_header;
    if (p_Var18 != (_Base_ptr)local_368._8_8_) {
      do {
        local_398 = p_Var18;
        if (p_Var18[1]._M_color !=
            *(_Rb_tree_color *)&((_Base_ptr)(local_368._0_8_ + 0x20))->_M_left) {
          p_Var33 = p_Var18[3]._M_parent;
          local_3f8 = p_Var18[3]._M_left;
          if (p_Var33 != local_3f8) {
            do {
              p_Var32 = &local_308._M_impl.super__Rb_tree_header;
              iVar16 = (**(code **)(**(long **)p_Var33 + 8))();
              if (iVar16 == 4) {
                p_Var18 = local_308._M_impl.super__Rb_tree_header._M_header._M_left;
                if ((_Rb_tree_header *)local_308._M_impl.super__Rb_tree_header._M_header._M_left !=
                    p_Var32) {
LAB_001521c3:
                  do {
                    local_3f0._0_8_ = &PTR_display_001eb100;
                    local_3f0._8_4_ = *(undefined4 *)&p_Var18[1]._M_parent;
                    (**(code **)(**(long **)p_Var33 + 0x10))
                              ((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                *)local_188);
                    if ((_Base_ptr)local_180._8_8_ == (_Base_ptr)0x0) {
LAB_00152241:
                      std::
                      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                   *)local_188);
                    }
                    else {
                      uVar11 = local_3f0._8_4_;
                      p_Var5 = (_Base_ptr)local_180._8_8_;
                      p_Var36 = (_Base_ptr)local_180;
                      do {
                        p_Var35 = p_Var36;
                        p_Var30 = p_Var5;
                        uVar2 = *(uint *)&p_Var30[1]._M_parent;
                        p_Var36 = p_Var30;
                        if (uVar2 < (uint)local_3f0._8_4_) {
                          p_Var36 = p_Var35;
                        }
                        p_Var5 = (&p_Var30->_M_left)[uVar2 < (uint)local_3f0._8_4_];
                      } while ((&p_Var30->_M_left)[uVar2 < (uint)local_3f0._8_4_] != (_Base_ptr)0x0)
                      ;
                      if (p_Var36 == (_Base_ptr)local_180) goto LAB_00152241;
                      if (uVar2 < (uint)local_3f0._8_4_) {
                        p_Var30 = p_Var35;
                      }
                      uVar2 = *(uint *)&p_Var30[1]._M_parent;
                      std::
                      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                      ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                   *)local_188);
                      if (uVar2 <= (uint)uVar11) {
                        pVar40 = std::
                                 _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 ::equal_range(&local_308,(key_type *)local_3f0);
                        std::
                        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        ::_M_erase_aux(&local_308,(_Base_ptr)pVar40.first._M_node,
                                       (_Base_ptr)pVar40.second._M_node);
                        break;
                      }
                    }
                    p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
                  } while ((_Rb_tree_header *)p_Var18 != &local_308._M_impl.super__Rb_tree_header);
                }
              }
              else {
                iVar16 = (**(code **)(**(long **)p_Var33 + 8))();
                p_Var18 = local_308._M_impl.super__Rb_tree_header._M_header._M_left;
                if ((_Rb_tree_header *)local_308._M_impl.super__Rb_tree_header._M_header._M_left !=
                    p_Var32 && iVar16 == 6) goto LAB_001521c3;
              }
              p_Var33 = (_Base_ptr)&p_Var33->_M_parent;
            } while (p_Var33 != local_3f8);
          }
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(local_398);
      } while (p_Var18 != (_Base_ptr)local_368._8_8_);
    }
    if (local_308._M_impl.super__Rb_tree_header._M_node_count != 0) {
      local_310 = (undefined1  [8])local_318;
      local_2c8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      local_2c8.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      local_258.
      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x0;
      pMVar19 = GlobalVarManager::get_init_func((GlobalVarManager *)local_310);
      p_Var18 = (pMVar19->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = p_Var18[3]._M_parent;
      p_Var5 = p_Var18[3]._M_left;
      if (p_Var33 != p_Var5) {
        bVar9 = 0;
        do {
          iVar16 = (**(code **)(**(long **)p_Var33 + 8))();
          this_01 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                     *)&local_258;
          if (!(bool)(bVar9 | iVar16 == 6)) {
            this_01 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                       *)&local_2c8;
          }
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (this_01,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                             p_Var33);
          p_Var33 = (_Base_ptr)&p_Var33->_M_parent;
          bVar9 = bVar9 | iVar16 == 6;
        } while (p_Var33 != p_Var5);
        p_Var33 = p_Var18[3]._M_parent;
        p_Var5 = p_Var18[3]._M_left;
        p_Var36 = p_Var33;
        if (p_Var5 != p_Var33) {
          do {
            if (*(long **)p_Var36 != (long *)0x0) {
              (**(code **)(**(long **)p_Var36 + 0x28))();
            }
            *(long *)p_Var36 = 0;
            p_Var36 = (_Base_ptr)&p_Var36->_M_parent;
          } while (p_Var36 != p_Var5);
          p_Var18[3]._M_left = p_Var33;
        }
      }
      local_1f8 = p_Var18;
      if ((_Rb_tree_header *)local_308._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_308._M_impl.super__Rb_tree_header) {
        local_1e0 = (map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)(local_380._16_8_ + 0x68);
        local_1f0 = &((_Base_ptr)(local_368._0_8_ + 0x60))->_M_parent;
        local_398 = (_Base_ptr)(local_380._16_8_ + 0x38);
        local_1e8 = (_func_int **)&PTR_display_001ed760;
        local_368._8_8_ = &PTR_display_001ed168;
        local_3f8 = (_Base_ptr)&PTR_display_001ecf68;
        p_Var18 = local_308._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          local_358.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          local_358.id = *(uint32_t *)&p_Var18[1]._M_parent;
          var_replace::Var_Replace::Var_Replace
                    ((Var_Replace *)local_188,(MirFunction *)local_380._16_8_);
          pmVar20 = std::
                    map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                    ::at((map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
                          *)&local_150,&local_358);
          local_280 = *pmVar20;
          local_1d8 = p_Var18;
          pmVar21 = std::
                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    ::at(local_1e0,&local_280.first);
          uVar39 = (ulong)local_280.second;
          pMVar6 = (MirPackage *)
                   (pmVar21->inst).
                   super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pmVar21->inst).
                            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) <=
              uVar39) {
            iVar16 = std::__throw_out_of_range_fmt
                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar39);
LAB_00153398:
            iVar16 = std::__throw_system_error(iVar16);
LAB_0015339f:
            iVar16 = std::__throw_system_error(iVar16);
LAB_001533a6:
            iVar16 = std::__throw_system_error(iVar16);
LAB_001533ad:
            uVar28 = std::__throw_system_error(iVar16);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::~vector(&local_258);
            std::
            vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ::~vector(&local_2c8);
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree(&local_308);
            std::
            _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
            ::~_Rb_tree(&local_98.defpoint._M_t);
            std::
            _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            ::~_Rb_tree(&local_98.usepoints._M_t);
            _Unwind_Resume(uVar28);
          }
          (**(code **)(*(long *)(((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                   *)&(&pMVar6->super_Displayable)[uVar39]._vptr_Displayable)->_M_t)
                                .
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false> + 0x10))
                    ((Function *)local_3f0);
          local_2d8 = &PTR_display_001eb100;
          local_2d0[0] = *(uint *)(local_3e0._8_8_ + 0x28);
          std::
          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                       *)local_3f0);
          pmVar22 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)local_398,local_2d0);
          iVar16 = (*(((pmVar22->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_Displayable)._vptr_Displayable[3])();
          if ((extraout_var & 1) == 0) {
            std::__throw_bad_optional_access();
          }
          iVar29 = iVar16 + 3;
          if (-1 < iVar16) {
            iVar29 = iVar16;
          }
          local_3f0._0_8_ = local_3f0._0_8_ & 0xffffffff00000000;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1d0,(long)(iVar29 >> 2),(value_type *)local_3f0,
                     (allocator_type *)&local_348);
          pcVar7 = (((string *)(local_380._16_8_ + 8))->_M_dataplus)._M_p;
          local_318 = pMVar6;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,pcVar7,
                     pcVar7 + ((string *)(local_380._16_8_ + 8))->_M_string_length);
          local_e0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
          local_e0.id = local_2d0[0];
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a0,&local_1d0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_d0 + 8),
                     &local_1a0);
          local_c8.
          super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          ._M_index = 1;
          local_d0 = (undefined1  [8])local_1e8;
          local_c8.
          super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          ._36_4_ = Word;
          local_a0._M_payload = (_Storage<int,_true>)0x0;
          local_a0._M_engaged = false;
          local_a0._5_3_ = 0;
          GlobalVarManager::add_global_var
                    (&local_2a8,(GlobalVarManager *)local_310,&local_278,&local_e0,
                     (ConstValue *)local_d0);
          (*std::__detail::__variant::
            __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
            ::_S_vtable._M_arr
            [local_c8.
             super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             .
             super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
             ._M_index]._M_data)
                    ((anon_class_1_0_00000001 *)local_3f0,
                     (variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_d0 + 8));
          local_c8.
          super__Variant_base<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super__Move_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_assign_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Move_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Copy_ctor_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          .
          super__Variant_storage_alias<unsigned_int,_std::vector<unsigned_int>,_std::__cxx11::basic_string<char>_>
          ._M_index = 0xff;
          if (local_1a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1a0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0
              ) || (plVar23 = (long *)__dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::
                                                                vtable +
                                                              *(long *)(std::clog + -0x18)),
                                                     &std::streambuf::typeinfo,
                                                     &AixLog::Log::typeinfo), plVar23 == (long *)0x0
                   )) {
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_3f0 + 0x10);
            local_3f0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x5;
            local_3e0._0_6_ = 0x6563617254;
            local_3f0._0_8_ = paVar1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,paVar1->_M_local_buf,5);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._0_8_ != paVar1) {
              operator_delete((void *)local_3f0._0_8_,
                              (ulong)((long)&(((Inst *)local_3e0._0_8_)->super_Displayable).
                                             _vptr_Displayable + 1));
            }
          }
          else {
            local_288 = (pthread_mutex_t *)(plVar23 + 0x29);
            iVar16 = pthread_mutex_lock(local_288);
            if (iVar16 != 0) goto LAB_00153398;
            if ((char)plVar23[0x10] != '\0') {
              (**(code **)(*plVar23 + 0x30))(plVar23);
              *(undefined1 *)(plVar23 + 0x10) = 0;
              plVar23[0x23] = 0;
              *(undefined1 *)(plVar23 + 0x24) = 1;
              local_3f0._0_8_ = &PTR__Tag_001eaf88;
              local_3e0._0_8_ = (RefInst *)0x0;
              local_3e0._8_8_ = local_3e0._8_8_ & 0xffffffffffffff00;
              local_3c8._M_p._0_1_ = 1;
              local_3f0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_3e0 + 8);
              std::__cxx11::string::_M_assign((string *)(plVar23 + 0x12));
              *(undefined1 *)(plVar23 + 0x16) = local_3c8._M_p._0_1_;
              local_3f0._0_8_ = &PTR__Tag_001eaf88;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f0._8_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3e0 + 8)) {
                operator_delete((void *)local_3f0._8_8_,(ulong)(local_3e0._8_8_ + 1));
              }
              AixLog::Function::Function((Function *)local_3f0,(nullptr_t)0x0);
              std::__cxx11::string::_M_assign((string *)(plVar23 + 0x18));
              std::__cxx11::string::_M_assign((string *)(plVar23 + 0x1c));
              *(bool *)(plVar23 + 0x21) = local_3a0;
              plVar23[0x20] = local_3a8;
              AixLog::Function::~Function((Function *)local_3f0);
              *(undefined1 *)(plVar23 + 0x25) = 1;
            }
            pthread_mutex_unlock(local_288);
          }
          local_348._M_head_impl = (RefInst *)&PTR__Tag_001eaf88;
          local_340 = &local_330;
          local_338 = 0;
          local_330 = 0;
          local_320 = 1;
          paVar1 = &local_418.field_2;
          if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) != 0
              ) && (lVar24 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                     *(long *)(std::clog + -0x18)),
                                            &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                   lVar24 != 0)) {
            iVar16 = pthread_mutex_lock((pthread_mutex_t *)(lVar24 + 0x148));
            if (iVar16 != 0) goto LAB_001533ad;
            std::__cxx11::string::_M_assign((string *)(lVar24 + 0x90));
            *(undefined1 *)(lVar24 + 0xb0) = local_320;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar24 + 0x148));
          }
          local_1b8.time_point.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_1b8._vptr_Timestamp = (_func_int **)&PTR__Timestamp_001eaf58;
          local_1b8.is_null_ = false;
          if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0
              ) || (lVar24 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                     *(long *)(std::clog + -0x18)),
                                            &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                   lVar24 == 0)) {
            local_390._M_head_impl = (RefInst *)0x15;
            local_418._M_dataplus._M_p = (pointer)paVar1;
            local_418._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&local_390);
            local_418.field_2._M_allocated_capacity = (size_type)local_390._M_head_impl;
            *(undefined8 *)local_418._M_dataplus._M_p = 0x64252d6d252d5925;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 8) = ' ';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 9) = '%';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 10) = 'H';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xb) = '-';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xc) = '%';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xd) = 'M';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xe) = '-';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xf) = '%';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xd) = 'M';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xe) = '-';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0xf) = '%';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0x10) = 'S';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0x11) = '.';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0x12) = '#';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0x13) = 'm';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_418._M_dataplus._M_p + 0x14) = 's';
            local_418._M_string_length = (size_type)local_390._M_head_impl;
            *(char *)((long)&((local_390._M_head_impl)->super_Inst).super_Displayable.
                             _vptr_Displayable + (long)local_418._M_dataplus._M_p) = '\0';
            AixLog::Timestamp::to_string((string *)local_3f0,&local_1b8,&local_418);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,(char *)local_3f0._0_8_,local_3f0._8_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3f0 + 0x10)) {
              operator_delete((void *)local_3f0._0_8_,
                              (ulong)((long)&(((Inst *)local_3e0._0_8_)->super_Displayable).
                                             _vptr_Displayable + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_dataplus._M_p != paVar1) {
              operator_delete(local_418._M_dataplus._M_p,
                              (ulong)(local_418.field_2._M_allocated_capacity + 1));
            }
          }
          else {
            iVar16 = pthread_mutex_lock((pthread_mutex_t *)(lVar24 + 0x148));
            if (iVar16 != 0) goto LAB_0015339f;
            *(bool *)(lVar24 + 0x120) = local_1b8.is_null_;
            ((duration *)(lVar24 + 0x118))->__r = (rep)local_1b8.time_point.__d.__r;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar24 + 0x148));
          }
          local_418._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"optimize_func","");
          local_390._M_head_impl = (RefInst *)local_380;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_390,
                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/func_array_global.cpp"
                     ,"");
          sVar10 = local_418._M_string_length;
          local_3f0._0_8_ = &PTR__Function_001eafb8;
          local_3c8._M_p = (pointer)&local_3b8;
          _Var34._M_p = local_418._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p == paVar1) {
            _uStack_3d0 = local_418.field_2._8_4_;
            uStack_3cc = local_418.field_2._12_4_;
            _Var34._M_p = (pointer)(local_3e0 + 8);
          }
          local_3e0._8_8_ = local_418.field_2._M_allocated_capacity;
          local_3e0._0_8_ = local_418._M_string_length;
          local_418._M_string_length = 0;
          local_418.field_2._M_allocated_capacity =
               local_418.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (local_390._M_head_impl == (RefInst *)local_380) {
            uStack_3b0 = local_380._8_4_;
            uStack_3ac = local_380._12_4_;
          }
          else {
            local_3c8._M_p = (pointer)local_390._M_head_impl;
          }
          uStack_3b4 = local_380._4_4_;
          local_3b8 = local_380._0_4_;
          local_3c0 = local_388;
          local_388 = 0;
          local_380._0_4_ = local_380._0_4_ & 0xffffff00;
          local_3a8 = 0x82;
          local_3a0 = false;
          local_418._M_dataplus._M_p = (pointer)paVar1;
          local_3f0._8_8_ = _Var34._M_p;
          local_390._M_head_impl = (RefInst *)local_380;
          if ((*(long *)(&__cxxabiv1::__class_type_info::vtable + *(long *)(std::clog + -0x18)) == 0
              ) || (lVar24 = __dynamic_cast(*(long *)(&__cxxabiv1::__class_type_info::vtable +
                                                     *(long *)(std::clog + -0x18)),
                                            &std::streambuf::typeinfo,&AixLog::Log::typeinfo,0),
                   lVar24 == 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,_Var34._M_p,sVar10);
          }
          else {
            iVar16 = pthread_mutex_lock((pthread_mutex_t *)(lVar24 + 0x148));
            if (iVar16 != 0) goto LAB_001533a6;
            std::__cxx11::string::_M_assign((string *)(lVar24 + 0xc0));
            std::__cxx11::string::_M_assign((string *)(lVar24 + 0xe0));
            *(bool *)(lVar24 + 0x108) = local_3a0;
            *(size_t *)(lVar24 + 0x100) = local_3a8;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar24 + 0x148));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::clog,"convert array ",0xe);
          (*(code *)*local_2d8)(&local_2d8,&std::clog);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"in ",3);
          poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::clog,
                               (((string *)(local_380._16_8_ + 8))->_M_dataplus)._M_p,
                               ((string *)(local_380._16_8_ + 8))->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25," to global array ",0x11);
          poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar25,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25,"",0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
          std::ostream::put((char)poVar25);
          std::ostream::flush();
          AixLog::Function::~Function((Function *)local_3f0);
          if (local_390._M_head_impl != (RefInst *)local_380) {
            operator_delete(local_390._M_head_impl,CONCAT44(local_380._4_4_,local_380._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p,
                            (ulong)(local_418.field_2._M_allocated_capacity + 1));
          }
          this_00 = local_1f0;
          local_348._M_head_impl = (RefInst *)&PTR__Tag_001eaf88;
          if (local_340 != &local_330) {
            operator_delete(local_340,CONCAT71(uStack_32f,local_330) + 1);
          }
          _Var26._M_head_impl = (Inst *)operator_new(0x40);
          uVar12 = local_358.id;
          local_3f0._0_8_ = local_3f0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3f0,local_2a8._M_dataplus._M_p,
                     local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
          uStack_3d0 = 1;
          ((_Var26._M_head_impl)->dest).super_Displayable = (Displayable)&PTR_display_001eb100;
          ((_Var26._M_head_impl)->dest).id = uVar12;
          (_Var26._M_head_impl)->super_Displayable = (Displayable)local_368._8_8_;
          std::__detail::__variant::
          _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(_Var26._M_head_impl + 1),
                            (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_3f0);
          local_348._M_head_impl = (RefInst *)_Var26._M_head_impl;
          std::__detail::__variant::
          _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_3f0);
          _Var13._M_head_impl = local_348._M_head_impl;
          local_348._M_head_impl = (RefInst *)0x0;
          _Var8.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
               (((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                &(&local_318->super_Displayable)[uVar39]._vptr_Displayable)->_M_t).
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>;
          (((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           &(&local_318->super_Displayable)[uVar39]._vptr_Displayable)->_M_t).
          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
          super__Head_base<0UL,_mir::inst::Inst_*,_false> =
               (_Head_base<0UL,_mir::inst::Inst_*,_false>)_Var13._M_head_impl;
          if (_Var8.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl != (Inst *)0x0) {
            (**(code **)(*(long *)_Var8.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl
                        + 0x28))();
          }
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     &local_348);
          p_Var18 = local_398;
          pmVar22 = std::
                    map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)local_398,&local_358.id);
          local_218 = local_3f8;
          local_210 = (pmVar22->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          local_208 = (pmVar22->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
          if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_208->_M_use_count = local_208->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_208->_M_use_count = local_208->_M_use_count + 1;
            }
          }
          local_200._0_1_ = pmVar22->is_memory_var;
          local_200._1_1_ = pmVar22->is_temp_var;
          local_200._2_1_ = pmVar22->is_phi_var;
          local_200._3_1_ = pmVar22->field_0x1b;
          local_200._4_4_ = pmVar22->priority;
          GlobalVarManager::get_new_init_id((GlobalVarManager *)&local_348,(Variable *)local_310);
          local_218 = local_3f8;
          if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
          }
          pRVar27 = (RefInst *)operator_new(0x40);
          uVar12 = (uint32_t)local_340;
          local_3f0._0_8_ = local_3f0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3f0,local_2a8._M_dataplus._M_p,
                     local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
          uStack_3d0 = 1;
          (pRVar27->super_Inst).dest.super_Displayable._vptr_Displayable =
               (_func_int **)&PTR_display_001eb100;
          (pRVar27->super_Inst).dest.id = uVar12;
          (pRVar27->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)local_368._8_8_;
          std::__detail::__variant::
          _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&pRVar27->val,
                            (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_3f0);
          local_390._M_head_impl = pRVar27;
          std::__detail::__variant::
          _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_3f0);
          local_418._M_dataplus._M_p = (pointer)local_390._M_head_impl;
          local_390._M_head_impl = (RefInst *)0x0;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)&local_2c8,
                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                     &local_418);
          if ((long *)local_418._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_418._M_dataplus._M_p + 0x28))();
          }
          local_418._M_dataplus._M_p = (pointer)0x0;
          std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                    ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                     &local_390);
          local_3f0._0_4_ = local_2d0[0];
          pVar41 = std::
                   _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   ::equal_range((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  *)p_Var18,(key_type_conflict *)local_3f0);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
          ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_mir::inst::Variable>,_std::_Select1st<std::pair<const_unsigned_int,_mir::inst::Variable>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          *)p_Var18,(_Base_ptr)pVar41.first._M_node,(_Base_ptr)pVar41.second._M_node
                        );
          __position._M_current =
               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               ((_Base_ptr)(local_368._0_8_ + 0x60))->_M_parent;
          while ((_Base_ptr)__position._M_current != ((_Base_ptr)(local_368._0_8_ + 0x60))->_M_left)
          {
            (*((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[2])((Function *)local_3f0);
            if ((RefInst *)local_3e0._0_8_ != (RefInst *)0x0) {
              pRVar27 = (RefInst *)local_3e0._0_8_;
              pRVar38 = (RefInst *)(local_3f0 + 8);
              do {
                pRVar37 = pRVar38;
                pRVar31 = pRVar27;
                uVar2 = *(uint *)((long)&(pRVar31->val).
                                         super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         ._M_u + 0x10);
                pRVar38 = pRVar31;
                if (uVar2 < local_358.id) {
                  pRVar38 = pRVar37;
                }
                pRVar27 = *(RefInst **)
                           (&(pRVar31->super_Inst).dest.id + (ulong)(uVar2 < local_358.id) * 2);
              } while (pRVar27 != (RefInst *)0x0);
              if (pRVar38 == (RefInst *)(local_3f0 + 8)) goto LAB_00152fc4;
              if (uVar2 < local_358.id) {
                pRVar31 = pRVar37;
              }
              if (local_358.id <
                  *(uint *)((long)&(pRVar31->val).
                                   super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .
                                   super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   ._M_u + 0x10)) goto LAB_00152fc4;
              iVar16 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[1])();
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)local_3f0);
              if (iVar16 != 4) goto LAB_00152fcc;
              iVar16 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[6])();
              local_3f0._0_8_ = CONCAT44(extraout_var_00,iVar16);
              local_f0 = &PTR_display_001eb100;
              local_e8 = local_358.id;
              local_100 = &PTR_display_001eb100;
              local_f8 = (uint32_t)local_340;
              (**(code **)(*(size_type *)local_3f0._0_8_ + 0x18))
                        (local_3f0._0_8_,&local_f0,&local_100);
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          *)&local_2c8,
                         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                         local_3f0);
              __position = std::
                           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       *)this_00,__position);
              _Var34._M_p = (pointer)local_3f0._0_8_;
              goto LAB_00153243;
            }
LAB_00152fc4:
            std::
            _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
            ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                         *)local_3f0);
LAB_00152fcc:
            (*((((__position._M_current)->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
              _vptr_Displayable[2])((Function *)local_3f0);
            if ((RefInst *)local_3e0._0_8_ == (RefInst *)0x0) {
LAB_00153029:
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)local_3f0);
LAB_00153031:
              __position._M_current = __position._M_current + 1;
            }
            else {
              pRVar27 = (RefInst *)local_3e0._0_8_;
              pRVar38 = (RefInst *)(local_3f0 + 8);
              do {
                pRVar37 = pRVar38;
                pRVar31 = pRVar27;
                uVar2 = *(uint *)((long)&(pRVar31->val).
                                         super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         .
                                         super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         .
                                         super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                         ._M_u + 0x10);
                pRVar38 = pRVar31;
                if (uVar2 < local_358.id) {
                  pRVar38 = pRVar37;
                }
                pRVar27 = *(RefInst **)
                           (&(pRVar31->super_Inst).dest.id + (ulong)(uVar2 < local_358.id) * 2);
              } while (pRVar27 != (RefInst *)0x0);
              if (pRVar38 == (RefInst *)(local_3f0 + 8)) goto LAB_00153029;
              if (uVar2 < local_358.id) {
                pRVar31 = pRVar37;
              }
              if (local_358.id <
                  *(uint *)((long)&(pRVar31->val).
                                   super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .
                                   super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   .
                                   super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                                   ._M_u + 0x10)) goto LAB_00153029;
              iVar16 = (*((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                         super_Displayable)._vptr_Displayable[1])();
              std::
              _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                           *)local_3f0);
              if (iVar16 != 6) goto LAB_00153031;
              iVar16 = std::__cxx11::string::compare
                                 ((char *)(((__position._M_current)->_M_t).
                                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                           _M_head_impl + 1));
              if (iVar16 == 0) {
                iVar16 = (*((((__position._M_current)->_M_t).
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                           super_Displayable)._vptr_Displayable[6])();
                local_418._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar16);
                local_110 = &PTR_display_001eb100;
                local_108 = local_358.id;
                local_120 = &PTR_display_001eb100;
                local_118 = (uint32_t)local_340;
                (**(code **)(*(size_type *)local_418._M_dataplus._M_p + 0x18))
                          (local_418._M_dataplus._M_p,&local_110,&local_120);
                pmVar22 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                *)local_398,
                               &((((__position._M_current)->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                                dest).id);
                local_238 = local_3f8;
                local_230 = (pmVar22->ty).
                            super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_228 = (pmVar22->ty).
                            super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    local_228->_M_use_count = local_228->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    local_228->_M_use_count = local_228->_M_use_count + 1;
                  }
                }
                local_220._0_1_ = pmVar22->is_memory_var;
                local_220._1_1_ = pmVar22->is_temp_var;
                local_220._2_1_ = pmVar22->is_phi_var;
                local_220._3_1_ = pmVar22->field_0x1b;
                local_220._4_4_ = pmVar22->priority;
                GlobalVarManager::get_new_init_id
                          ((GlobalVarManager *)local_3f0,(Variable *)local_310);
                *(undefined4 *)(local_418._M_dataplus._M_p + 0x10) = local_3f0._8_4_;
                local_238 = local_3f8;
                if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
                }
                std::
                vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                ::
                emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                          ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                            *)&local_2c8,
                           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                           &local_418);
                __position = std::
                             vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                             ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                         *)this_00,__position);
                _Var34._M_p = local_418._M_dataplus._M_p;
LAB_00153243:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var34._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  (**(code **)(*(size_type *)_Var34._M_p + 0x28))();
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
          }
          p_Var17 = local_1d8;
          if (local_1d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1d0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1d0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1d0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
          ::~_Rb_tree(&local_150);
          std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                       *)local_180);
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
        } while ((_Rb_tree_header *)p_Var18 != &local_308._M_impl.super__Rb_tree_header);
      }
      puVar14 = local_2c8.
                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      p_Var18 = local_1f8 + 3;
      for (__args = local_2c8.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar15 = local_258.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
          __args_00 = local_258.
                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, __args != puVar14;
          __args = __args + 1) {
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)&p_Var18->_M_parent,__args);
      }
      for (; __args_00 != puVar15; __args_00 = __args_00 + 1) {
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                    *)&p_Var18->_M_parent,__args_00);
      }
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector(&local_258);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::~vector(&local_2c8);
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_308);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
    ::~_Rb_tree(&local_98.defpoint._M_t);
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::~_Rb_tree(&local_98.usepoints._M_t);
  }
  return;
}

Assistant:

void Func_Array_Global::optimize_func(mir::inst::MirFunction& func,
                                      mir::inst::MirPackage& mir) {
  if (!func.basic_blks.size() || func.name == "$$5_main") {
    return;
  }
  auto& startBlk = func.basic_blks.begin()->second;
  var_replace::Var_Replace vp(func);
  std::set<mir::inst::VarId> ref_results;
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref &&
        inst->useVars().size()) {
      ref_results.insert(inst->dest);
    }
  }
  for (auto& inst : startBlk.inst) {
    if (inst->inst_kind() == mir::inst::InstKind::Store) {
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    } else if (inst->inst_kind() == mir::inst::InstKind::Call) {
      auto& i = *inst;
      auto call = dynamic_cast<mir::inst::CallInst*>(&i);
      if (call->func == "memset") {
        continue;
      }
      auto vars = inst->useVars();
      if (vars.size() > 1) {  // store must be all const(except addr)
        for (auto var : vars) {
          if (ref_results.count(var)) {
            ref_results.erase(var);
          }
        }
      }
    }
  }

  for (auto& blk : func.basic_blks) {
    if (blk.first == startBlk.id) {
      continue;
    }
    for (auto& inst : blk.second.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Store ||
          inst->inst_kind() == mir::inst::InstKind::Call) {
        for (auto var : ref_results) {
          if (inst->useVars().count(var)) {
            ref_results.erase(var);
            break;
          }
        }
      }
    }
  }

  if (ref_results.size()) {
    GlobalVarManager gvm(mir);
    std::vector<std::unique_ptr<mir::inst::Inst>> init_insts;
    std::vector<std::unique_ptr<mir::inst::Inst>> call_insts;
    bool after_call = false;
    auto& init_func = gvm.get_init_func();
    auto& init_blk = init_func.basic_blks.begin()->second;
    for (auto& inst : init_blk.inst) {
      if (inst->inst_kind() == mir::inst::InstKind::Call) {
        after_call = true;
      }
      if (after_call) {
        call_insts.push_back(std::move(inst));
      } else {
        init_insts.push_back(std::move(inst));
      }
    }
    init_blk.inst.clear();
    for (auto var : ref_results) {
      var_replace::Var_Replace vp(func);
      auto def_point = vp.defpoint.at(var);
      auto& inst =
          func.basic_blks.at(def_point.first).inst.at(def_point.second);
      auto ref_var = *inst->useVars().begin();
      std::vector<uint32_t> val(func.variables.at(ref_var.id).size() / 4, 0);
      auto name = gvm.add_global_var(func.name, ref_var, val);
      LOG(TRACE) << "convert array " << ref_var << "in " << func.name
                 << " to global array " << name << "" << std::endl;
      inst = std::make_unique<mir::inst::RefInst>(var, name);
      auto init_var = gvm.get_new_init_id(func.variables.at(var.id));
      init_insts.push_back(
          std::make_unique<mir::inst::RefInst>(init_var, name));
      func.variables.erase(ref_var);

      for (auto iter = startBlk.inst.begin(); iter != startBlk.inst.end();) {
        auto& inst = *iter;
        if (inst->useVars().count(var) &&
            inst->inst_kind() == mir::inst::InstKind::Store) {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          ptr->replace(var, init_var);
          init_insts.push_back(std::move(ptr));
          iter = startBlk.inst.erase(iter);
        } else if (inst->useVars().count(var) &&
                   inst->inst_kind() == mir::inst::InstKind::Call) {
          auto& inst = *iter;
          auto& i = *inst;
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          if (callInst->func == "memset") {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            ptr->replace(var, init_var);
            ptr->dest = gvm.get_new_init_id(func.variables.at(inst->dest.id));
            init_insts.push_back(std::move(ptr));
            iter = startBlk.inst.erase(iter);
          }
        } else {
          iter++;
        }
      }
    }

    for (auto& inst : init_insts) {
      init_blk.inst.push_back(std::move(inst));
    }

    for (auto& inst : call_insts) {
      init_blk.inst.push_back(std::move(inst));
    }
  }
}